

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_float_convert.cpp
# Opt level: O0

void local_float_convert::get_random_digit_string<71ul,2ul>(string *str)

{
  int iVar1;
  result_type rVar2;
  ranlux24_base *__urng;
  linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *__urng_00;
  result_type_conflict __n;
  reference pvVar3;
  mt19937 *pmVar4;
  size_type sVar5;
  ulong local_30;
  size_type pos;
  result_type_conflict len;
  bool is_neg;
  string *str_local;
  
  if (get_random_digit_string<71ul,2ul>(std::__cxx11::string&)::dist_sgn == '\0') {
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      get_random_digit_string<71UL,_2UL>::dist_sgn = unsigned_dist_maker<unsigned_int>(0,1);
      __cxa_guard_release(&get_random_digit_string<71ul,2ul>(std::__cxx11::string&)::dist_sgn);
    }
  }
  if (get_random_digit_string<71ul,2ul>(std::__cxx11::string&)::dist_len == '\0') {
    iVar1 = __cxa_guard_acquire(&get_random_digit_string<71ul,2ul>(std::__cxx11::string&)::dist_len)
    ;
    if (iVar1 != 0) {
      get_random_digit_string<71UL,_2UL>::dist_len = unsigned_dist_maker<unsigned_long>(2,0x47);
      __cxa_guard_release(&get_random_digit_string<71ul,2ul>(std::__cxx11::string&)::dist_len);
    }
  }
  if (get_random_digit_string<71ul,2ul>(std::__cxx11::string&)::dist_first == '\0') {
    iVar1 = __cxa_guard_acquire(&get_random_digit_string<71ul,2ul>(std::__cxx11::string&)::
                                 dist_first);
    if (iVar1 != 0) {
      get_random_digit_string<71UL,_2UL>::dist_first = unsigned_dist_maker<unsigned_int>(1,9);
      __cxa_guard_release(&get_random_digit_string<71ul,2ul>(std::__cxx11::string&)::dist_first);
    }
  }
  if (get_random_digit_string<71ul,2ul>(std::__cxx11::string&)::dist_following == '\0') {
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      get_random_digit_string<71UL,_2UL>::dist_following = unsigned_dist_maker<unsigned_int>(0,9);
      __cxa_guard_release(&get_random_digit_string<71ul,2ul>(std::__cxx11::string&)::dist_following)
      ;
    }
  }
  __urng = engine_sgn();
  rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                    (&get_random_digit_string<71UL,_2UL>::dist_sgn,__urng);
  __urng_00 = engine_e10();
  __n = std::uniform_int_distribution<unsigned_long>::operator()
                  (&get_random_digit_string<71UL,_2UL>::dist_len,__urng_00);
  if (rVar2 == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize(str,__n)
    ;
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              (str,__n + 1);
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                       (str,0);
    *pvVar3 = '-';
  }
  local_30 = (ulong)(rVar2 != 0);
  pmVar4 = engine_man();
  rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                    (&get_random_digit_string<71UL,_2UL>::dist_first,pmVar4);
  pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     (str,local_30);
  *pvVar3 = (char)rVar2 + '0';
  while( true ) {
    local_30 = local_30 + 1;
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      (str);
    if (sVar5 <= local_30) break;
    pmVar4 = engine_man();
    rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                      (&get_random_digit_string<71UL,_2UL>::dist_following,pmVar4);
    pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                       (str,local_30);
    *pvVar3 = (char)rVar2 + '0';
  }
  return;
}

Assistant:

auto get_random_digit_string(std::string& str) -> void // NOLINT(google-runtime-references)
  {
    static_assert(MinDigitsToGet >=  2U, "Error: The minimum number of digits to get must be  2 or more");

    static auto dist_sgn = unsigned_dist_maker(static_cast<unsigned>(UINT8_C(0)),
                                               static_cast<unsigned>(UINT8_C(1)));

    static auto dist_len = unsigned_dist_maker(MinDigitsToGet, MaxDigitsToGet);

    static auto dist_first = unsigned_dist_maker(static_cast<unsigned>(UINT8_C(1)),
                                                 static_cast<unsigned>(UINT8_C(9)));

    static auto dist_following = unsigned_dist_maker(static_cast<unsigned>(UINT8_C(0)),
                                                     static_cast<unsigned>(UINT8_C(9)));

    const bool is_neg = (dist_sgn(engine_sgn()) != 0);

    const auto len = dist_len(engine_e10());

    auto pos = static_cast<std::string::size_type>(0U);

    if(is_neg)
    {
      str.resize(len + 1U);

      str.at(pos) = '-';

      ++pos;
    }
    else
    {
      str.resize(len);
    }

    str.at(pos) =
      static_cast<char>
      (
          dist_first(engine_man())
        + static_cast<std::uniform_int_distribution<unsigned>::result_type>(UINT32_C(0x30))
      );

    ++pos;

    while(pos < str.length())
    {
      str.at(pos) =
        static_cast<char>
        (
            dist_following(engine_man())
          + static_cast<std::uniform_int_distribution<unsigned>::result_type>(UINT32_C(0x30))
        );

      ++pos;
    }
  }